

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ostream *poVar9;
  cmGlobalGenerator *gg;
  string *psVar10;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar11;
  undefined1 extraout_DL_01;
  uint uVar12;
  string *psVar13;
  ulong uVar14;
  pointer pbVar15;
  string value;
  string kdevError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar12 = 1;
  bVar4 = false;
  bVar5 = false;
  while( true ) {
    uVar14 = (ulong)uVar12;
    pbVar15 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5) <= uVar14)
    break;
    pbVar15 = pbVar15 + uVar14;
    lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0565);
    if ((lVar7 == 0) || (lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d058a), lVar7 == 0))
    {
      std::__cxx11::string::substr((ulong)&value,(ulong)pbVar15);
      if ((value._M_string_length == 0) &&
         ((uVar12 = uVar12 + 1,
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar12 ||
          (std::__cxx11::string::_M_assign((string *)&value), *value._M_dataplus._M_p == '-')))) {
        bVar3 = false;
        cmSystemTools::Error
                  ("No source directory specified for -S",(char *)0x0,(char *)0x0,(char *)0x0);
      }
      else {
        cmsys::SystemTools::CollapseFullPath(&kdevError,&value);
        std::__cxx11::string::operator=((string *)&value,(string *)&kdevError);
        std::__cxx11::string::~string((string *)&kdevError);
        cmsys::SystemTools::ConvertToUnixSlashes(&value);
        bVar3 = true;
        SetHomeDirectory(this,&value);
      }
      goto LAB_00156f43;
    }
    lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d058d);
    if (lVar7 == 0) goto LAB_00156f54;
    lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d05b1);
    if (lVar7 == 0) {
      std::__cxx11::string::substr((ulong)&value,(ulong)pbVar15);
      if ((value._M_string_length == 0) &&
         ((uVar12 = uVar12 + 1,
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar12 ||
          (std::__cxx11::string::_M_assign((string *)&value), *value._M_dataplus._M_p == '-')))) {
        bVar3 = false;
        cmSystemTools::Error
                  ("No build directory specified for -B",(char *)0x0,(char *)0x0,(char *)0x0);
      }
      else {
        cmsys::SystemTools::CollapseFullPath(&kdevError,&value);
        std::__cxx11::string::operator=((string *)&value,(string *)&kdevError);
        std::__cxx11::string::~string((string *)&kdevError);
        cmsys::SystemTools::ConvertToUnixSlashes(&value);
        bVar3 = true;
        SetHomeOutputDirectory(this,&value);
      }
      goto LAB_00156f43;
    }
    lVar7 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar14 < lVar7 - 2U) {
      lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d05b4);
      if (lVar7 == 0) {
        std::__cxx11::string::_M_assign((string *)&this->CheckBuildSystemArgument);
        uVar12 = uVar12 + 2;
        iVar6 = atoi((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p);
        this->ClearBuildSystem = 0 < iVar6;
        goto LAB_00156f54;
      }
      lVar7 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    uVar8 = lVar7 - 1;
    if (uVar14 < uVar8) {
      lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d05c9);
      psVar13 = (string *)&this->CheckStampFile;
      if (lVar7 != 0) {
        uVar8 = ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
        goto LAB_00156bdd;
      }
LAB_00156fb7:
      uVar12 = uVar12 + 1;
      std::__cxx11::string::_M_assign(psVar13);
    }
    else {
LAB_00156bdd:
      if ((uVar14 < uVar8) &&
         (lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d05dc),
         psVar13 = (string *)&this->CheckStampList, lVar7 == 0)) goto LAB_00156fb7;
      lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d02fe);
      if (((lVar7 == 0) ||
          (lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0400), lVar7 == 0)) ||
         (lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0421), lVar7 == 0)) {
        uVar12 = uVar12 + (pbVar15->_M_string_length == 2);
      }
      else {
        lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0464);
        if ((lVar7 == 0) ||
           (lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d048b), lVar7 == 0)) {
          uVar12 = uVar12 + 1;
        }
        else {
          lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d03b2);
          if (lVar7 != 0) {
            lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d05ef);
            if (lVar7 == 0) {
              std::__cxx11::string::substr((ulong)&value,(ulong)pbVar15);
              cmsys::SystemTools::CollapseFullPath(&kdevError,&value);
              std::__cxx11::string::operator=((string *)&value,(string *)&kdevError);
              std::__cxx11::string::~string((string *)&kdevError);
              cmsys::SystemTools::ConvertToUnixSlashes(&value);
              std::__cxx11::string::_M_assign((string *)&this->GraphVizFile);
              if ((this->GraphVizFile)._M_string_length == 0) {
                cmSystemTools::Error
                          ("No file specified for --graphviz",(char *)0x0,(char *)0x0,(char *)0x0);
              }
LAB_001570bc:
              std::__cxx11::string::~string((string *)&value);
            }
            else {
              lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d061c);
              if (lVar7 == 0) {
                std::operator<<((ostream *)&std::cout,"debug trycompile on\n");
                this->DebugTryCompile = true;
              }
              else {
                lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0644);
                if (lVar7 == 0) {
                  std::operator<<((ostream *)&std::cout,"Running with debug output on.\n");
                  this->DebugOutput = true;
                }
                else {
                  lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0672);
                  if (lVar7 == 0) {
                    std::operator<<((ostream *)&std::cout,"Running with expanded trace output on.\n"
                                   );
                    this->Trace = true;
                    this->TraceExpand = true;
                  }
                  else {
                    lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d06a9);
                    if (lVar7 == 0) {
                      std::__cxx11::string::substr((ulong)&value,(ulong)pbVar15);
                      cmsys::SystemTools::ConvertToUnixSlashes(&value);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&this->TraceOnlyThisSources,&value);
                      this->Trace = true;
                      goto LAB_001570bc;
                    }
                    lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d06b9);
                    if (lVar7 == 0) {
                      std::operator<<((ostream *)&std::cout,"Running with trace output on.\n");
                      this->Trace = true;
                      this->TraceExpand = false;
                    }
                    else {
                      lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d06e0);
                      if (lVar7 == 0) {
                        std::operator<<((ostream *)&std::cout,"Warn about uninitialized values.\n");
                        this->WarnUninitialized = true;
                      }
                      else {
                        lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0717);
                        if (lVar7 == 0) {
                          std::operator<<((ostream *)&std::cout,"Finding unused variables.\n");
                          this->WarnUnused = true;
                        }
                        else {
                          lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0745);
                          if (lVar7 == 0) {
                            poVar9 = std::operator<<((ostream *)&std::cout,
                                                                                                          
                                                  "Not searching for unused variables given on the "
                                                  );
                            std::operator<<(poVar9,"command line.\n");
                            this->WarnUnusedCli = false;
                          }
                          else {
                            lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d079a);
                            if (lVar7 == 0) {
                              poVar9 = std::operator<<((ostream *)&std::cout,
                                                                                                              
                                                  "Also check system files when warning about unused and "
                                                  );
                              std::operator<<(poVar9,"uninitialized variables.\n");
                              this->CheckSystemVars = true;
                            }
                            else {
                              lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0819);
                              if (lVar7 == 0) {
                                std::__cxx11::string::substr((ulong)&value,(ulong)pbVar15);
                                if (value._M_string_length == 0) {
                                  uVar12 = uVar12 + 1;
                                  if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                      <= (ulong)uVar12) {
                                    bVar3 = false;
                                    cmSystemTools::Error
                                              ("No platform specified for -A",(char *)0x0,
                                               (char *)0x0,(char *)0x0);
                                    goto LAB_00156f43;
                                  }
                                  std::__cxx11::string::_M_assign((string *)&value);
                                }
                                if (bVar4) {
                                  bVar3 = false;
                                  cmSystemTools::Error
                                            ("Multiple -A options not allowed",(char *)0x0,
                                             (char *)0x0,(char *)0x0);
                                  bVar4 = true;
                                }
                                else {
                                  bVar3 = true;
                                  std::__cxx11::string::_M_assign
                                            ((string *)&this->GeneratorPlatform);
                                  bVar4 = true;
                                }
                              }
                              else {
                                lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0855);
                                if (lVar7 != 0) {
                                  lVar7 = std::__cxx11::string::find((char *)pbVar15,0x3d0893);
                                  if (lVar7 != 0) {
                                    SetDirectoriesFromFile(this,(pbVar15->_M_dataplus)._M_p);
                                    goto LAB_00156f54;
                                  }
                                  std::__cxx11::string::substr((ulong)&value,(ulong)pbVar15);
                                  if (value._M_string_length == 0) {
                                    uVar12 = uVar12 + 1;
                                    if ((ulong)uVar12 <
                                        (ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5))
                                    {
                                      std::__cxx11::string::_M_assign((string *)&value);
                                      goto LAB_001572c4;
                                    }
                                    cmSystemTools::Error
                                              ("No generator specified for -G",(char *)0x0,
                                               (char *)0x0,(char *)0x0);
                                    PrintGeneratorList(this);
                                    bVar3 = false;
                                  }
                                  else {
LAB_001572c4:
                                    gg = CreateGlobalGenerator(this,&value);
                                    if (gg == (cmGlobalGenerator *)0x0) {
                                      kdevError._M_dataplus._M_p = (pointer)&kdevError.field_2;
                                      kdevError._M_string_length = 0;
                                      kdevError.field_2._M_local_buf[0] = '\0';
                                      lVar7 = std::__cxx11::string::find((char *)&value,0x3d0896);
                                      if (lVar7 != -1) {
                                        std::__cxx11::string::assign((char *)&kdevError);
                                      }
                                      std::operator+(&local_50,"Could not create named generator ",
                                                     &value);
                                      std::operator+(&local_70,&local_50,&kdevError);
                                      cmSystemTools::Error(&local_70);
                                      std::__cxx11::string::~string((string *)&local_70);
                                      std::__cxx11::string::~string((string *)&local_50);
                                      PrintGeneratorList(this);
                                      std::__cxx11::string::~string((string *)&kdevError);
                                      bVar3 = true;
                                    }
                                    else {
                                      bVar3 = true;
                                      SetGlobalGenerator(this,gg);
                                    }
                                  }
                                  std::__cxx11::string::~string((string *)&value);
                                  if (!bVar3) {
                                    return;
                                  }
                                  goto LAB_00156f54;
                                }
                                std::__cxx11::string::substr((ulong)&value,(ulong)pbVar15);
                                if (value._M_string_length == 0) {
                                  uVar12 = uVar12 + 1;
                                  if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                      <= (ulong)uVar12) {
                                    bVar3 = false;
                                    cmSystemTools::Error
                                              ("No toolset specified for -T",(char *)0x0,(char *)0x0
                                               ,(char *)0x0);
                                    goto LAB_00156f43;
                                  }
                                  std::__cxx11::string::_M_assign((string *)&value);
                                }
                                if (bVar5) {
                                  bVar3 = false;
                                  cmSystemTools::Error
                                            ("Multiple -T options not allowed",(char *)0x0,
                                             (char *)0x0,(char *)0x0);
                                  bVar5 = true;
                                }
                                else {
                                  bVar3 = true;
                                  std::__cxx11::string::_M_assign((string *)&this->GeneratorToolset)
                                  ;
                                  bVar5 = true;
                                }
                              }
LAB_00156f43:
                              std::__cxx11::string::~string((string *)&value);
                              if (!bVar3) {
                                return;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00156f54:
    uVar12 = uVar12 + 1;
  }
  psVar10 = GetHomeDirectory_abi_cxx11_(this);
  sVar1 = psVar10->_M_string_length;
  psVar10 = GetHomeOutputDirectory_abi_cxx11_(this);
  sVar2 = psVar10->_M_string_length;
  if ((sVar2 == 0 && sVar1 == 0) && this->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,
               "No source or binary directory provided. Both will be assumed to be the same as the current working directory, but note that this warning will become a fatal error in future CMake releases."
               ,(allocator<char> *)&local_70);
    kdevError._M_dataplus._M_p = (pointer)0x0;
    kdevError._M_string_length = 0;
    IssueMessage(this,WARNING,&value,(cmListFileBacktrace *)&kdevError);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&kdevError._M_string_length);
    std::__cxx11::string::~string((string *)&value);
    uVar11 = extraout_DL_00;
  }
  else {
    uVar11 = extraout_DL;
    if (sVar1 != 0) goto LAB_001574af;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&value,(SystemTools *)0x1,(bool)uVar11);
  SetHomeDirectory(this,&value);
  std::__cxx11::string::~string((string *)&value);
  uVar11 = extraout_DL_01;
LAB_001574af:
  if (sVar2 == 0) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&value,(SystemTools *)0x1,(bool)uVar11);
    SetHomeOutputDirectory(this,&value);
    std::__cxx11::string::~string((string *)&value);
  }
  return;
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args)
{
  bool haveToolset = false;
  bool havePlatform = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-H", 0) == 0 || arg.find("-S", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
    } else if (arg.find("-O", 0) == 0) {
      // There is no local generate anymore.  Ignore -O option.
    } else if (arg.find("-B", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
    } else if ((i < args.size() - 2) &&
               (arg.find("--check-build-system", 0) == 0)) {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-file", 0) == 0)) {
      this->CheckStampFile = args[++i];
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-list", 0) == 0)) {
      this->CheckStampList = args[++i];
    }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if ((i < args.size() - 1) &&
             (arg.find("--vs-solution-file", 0) == 0)) {
      this->VSSolutionFile = args[++i];
    }
#endif
    else if (arg.find("-D", 0) == 0) {
      // skip for now
      // in case '-D var=val' is given, also skip the next
      // in case '-Dvar=val' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-U", 0) == 0) {
      // skip for now
      // in case '-U var' is given, also skip the next
      // in case '-Uvar' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-C", 0) == 0) {
      // skip for now
      // in case '-C path' is given, also skip the next
      // in case '-Cpath' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-P", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("--find-package", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("-W", 0) == 0) {
      // skip for now
    } else if (arg.find("--graphviz=", 0) == 0) {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if (this->GraphVizFile.empty()) {
        cmSystemTools::Error("No file specified for --graphviz");
      }
    } else if (arg.find("--debug-trycompile", 0) == 0) {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
    } else if (arg.find("--debug-output", 0) == 0) {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
    } else if (arg.find("--trace-expand", 0) == 0) {
      std::cout << "Running with expanded trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(true);
    } else if (arg.find("--trace-source=", 0) == 0) {
      std::string file = arg.substr(strlen("--trace-source="));
      cmSystemTools::ConvertToUnixSlashes(file);
      this->AddTraceSource(file);
      this->SetTrace(true);
    } else if (arg.find("--trace", 0) == 0) {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(false);
    } else if (arg.find("--warn-uninitialized", 0) == 0) {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
    } else if (arg.find("--warn-unused-vars", 0) == 0) {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
    } else if (arg.find("--no-warn-unused-cli", 0) == 0) {
      std::cout << "Not searching for unused variables given on the "
                << "command line.\n";
      this->SetWarnUnusedCli(false);
    } else if (arg.find("--check-system-vars", 0) == 0) {
      std::cout << "Also check system files when warning about unused and "
                << "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
    } else if (arg.find("-A", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No platform specified for -A");
          return;
        }
        value = args[i];
      }
      if (havePlatform) {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
      }
      this->GeneratorPlatform = value;
      havePlatform = true;
    } else if (arg.find("-T", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No toolset specified for -T");
          return;
        }
        value = args[i];
      }
      if (haveToolset) {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
      }
      this->GeneratorToolset = value;
      haveToolset = true;
    } else if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        std::string kdevError;
        if (value.find("KDevelop3", 0) != std::string::npos) {
          kdevError = "\nThe KDevelop3 generator is not supported anymore.";
        }

        cmSystemTools::Error("Could not create named generator " + value +
                             kdevError);
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(gen);
      }
    }
    // no option assume it is the path to the source or an existing build
    else {
      this->SetDirectoriesFromFile(arg.c_str());
    }
  }